

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreMapping.c
# Opt level: O0

xcore_reg XCore_reg_id(char *name)

{
  int iVar1;
  uint local_1c;
  int i;
  char *name_local;
  
  local_1c = 1;
  while( true ) {
    if (0x19 < local_1c) {
      return XCORE_REG_INVALID;
    }
    iVar1 = strcmp(name,reg_name_maps[(int)local_1c].name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return reg_name_maps[(int)local_1c].id;
}

Assistant:

xcore_reg XCore_reg_id(char *name)
{
	int i;

	for(i = 1; i < ARR_SIZE(reg_name_maps); i++) {
		if (!strcmp(name, reg_name_maps[i].name))
			return reg_name_maps[i].id;
	}

	// not found
	return 0;
}